

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O3

size_t __thiscall
mocker::detail::InterferenceGraph::NodePairHash::operator()(NodePairHash *this,NodePair *nodePair)

{
  element_type *peVar1;
  pointer pcVar2;
  long *plVar3;
  size_t sVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  ulong local_30;
  long local_28;
  long lStack_20;
  
  peVar1 = (nodePair->first).super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar2 = (peVar1->identifier)._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + (peVar1->identifier)._M_string_length);
  std::__cxx11::string::append((char *)local_58);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_58,
                              (ulong)(((nodePair->second).
                                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->identifier)._M_dataplus._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_28 = *plVar5;
    lStack_20 = plVar3[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar5;
    local_38 = (long *)*plVar3;
  }
  local_30 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  sVar4 = std::_Hash_bytes(local_38,local_30,0xc70f6907);
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return sVar4;
}

Assistant:

std::size_t operator()(const NodePair &nodePair) const {
      return std::hash<std::string>{}(nodePair.first->getIdentifier() + "," +
                                      nodePair.second->getIdentifier());
    }